

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall lest::confirm::~confirm(confirm *this)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *plVar5;
  long *local_e8;
  long local_e0;
  long local_d8;
  undefined8 uStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  undefined8 uStack_b0;
  long *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  long *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_001088a5;
    poVar3 = (this->super_action).os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"All ",4);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"test","");
    if (this->selected == 1) {
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_68,local_60 + (long)local_68);
    }
    else {
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_68,local_60 + (long)local_68);
      std::__cxx11::string::append((char *)&local_e8);
      local_c8 = &local_b8;
      if (local_e8 == &local_d8) {
        uStack_b0 = uStack_d0;
      }
      else {
        local_c8 = local_e8;
      }
      local_b8 = local_d8;
      local_c0 = local_e0;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_c8,local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_a8 = (long *)&local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"passed.\n","");
    lVar2 = local_a0;
    if (local_a8 == (long *)&local_98) {
      uStack_d0 = uStack_90;
      local_e8 = &local_d8;
    }
    else {
      local_e8 = local_a8;
    }
    local_d8 = CONCAT71(uStack_97,local_98);
    local_e0 = local_a0;
    local_a0 = 0;
    local_98 = 0;
    local_a8 = (long *)&local_98;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_e8,lVar2);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_a8 != (long *)&local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    plVar5 = local_68;
    if (local_68 == local_58) goto LAB_001088a5;
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," out of ",8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"test","");
    if (this->selected == 1) {
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_48,local_40 + (long)local_48);
    }
    else {
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_48,local_40 + (long)local_48);
      std::__cxx11::string::append((char *)&local_e8);
      local_c8 = &local_b8;
      if (local_e8 == &local_d8) {
        uStack_b0 = uStack_d0;
      }
      else {
        local_c8 = local_e8;
      }
      local_b8 = local_d8;
      local_c0 = local_e0;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_c8,local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_88 = (long *)&local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"failed.\n","");
    lVar2 = local_80;
    if (local_88 == (long *)&local_78) {
      uStack_d0 = uStack_70;
      local_e8 = &local_d8;
    }
    else {
      local_e8 = local_88;
    }
    local_d8 = CONCAT71(uStack_77,local_78);
    local_e0 = local_80;
    local_80 = 0;
    local_78 = 0;
    local_88 = (long *)&local_78;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_e8,lVar2);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_88 != (long *)&local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    local_58[0] = local_38[0];
    plVar5 = local_48;
    if (local_48 == local_38) goto LAB_001088a5;
  }
  operator_delete(plVar5,local_58[0] + 1);
LAB_001088a5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  paVar4 = &(this->output).testing.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }